

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmBrReg1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1,int C1)

{
  Data *this_00;
  undefined4 local_34;
  RegSlot local_30;
  OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  local_34 = 0xc;
  this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
  local_30 = R1;
  layout.RelativeJumpOffset = C1;
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,&this->super_ByteCodeWriter,false);
  ByteCodeWriter::Data::Write(this_00,&local_34,0xc);
  AddJumpOffset(this,EndOfBlock,labelID,0xc);
  return true;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg1Const1(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1, int C1)
    {
        OpLayoutT_BrInt1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1) && SizePolicy::Assign(layout.C1, C1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt1Const1<SizePolicy>) - offsetof(OpLayoutT_BrInt1Const1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }